

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::BrEnvProperty
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,PropertyIdIndexType index,
          int32 slotIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_3e;
  PropertyIdIndexType local_3c;
  undefined1 auStack_38 [2];
  OpLayoutBrEnvProperty data;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x1b);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    data.PropertyIdIndex = index;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x396,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    index = data.PropertyIdIndex;
  }
  CheckLabel(this,labelID);
  local_3e = 10;
  local_3c = index;
  _auStack_38 = slotIndex;
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_3e,10,this);
  AddJumpOffset(this,op,labelID,10);
  return;
}

Assistant:

void ByteCodeWriter::BrEnvProperty(OpCode op, ByteCodeLabel labelID, PropertyIdIndexType index, int32 slotIndex)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrEnvProperty);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrEnvProperty) - offsetof(OpLayoutBrEnvProperty, RelativeJumpOffset);
        OpLayoutBrEnvProperty data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.SlotIndex = slotIndex;
        data.PropertyIdIndex = index;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }